

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

char * Acb_RemapOneFunction(char *pStr,Vec_Int_t *vSupp,Vec_Int_t *vMap,int nVars)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p;
  char *pcVar3;
  long lVar4;
  
  p = Vec_StrAlloc(100);
  pcVar3 = strtok(pStr,"\n");
  iVar1 = 0;
  if (0 < nVars) {
    iVar1 = nVars;
  }
LAB_0032ddf8:
  iVar2 = iVar1;
  if (pcVar3 == (char *)0x0) {
    Vec_StrPush(p,'\0');
    pcVar3 = p->pArray;
    p->nCap = 0;
    p->nSize = 0;
    p->pArray = (char *)0x0;
    Vec_StrFree(p);
    return pcVar3;
  }
  while (iVar2 != 0) {
    Vec_StrPush(p,'-');
    iVar2 = iVar2 + -1;
  }
  lVar4 = 0;
  do {
    if (pcVar3[lVar4] != '-') {
      if (pcVar3[lVar4] == ' ') break;
      iVar2 = Vec_IntEntry(vSupp,(int)lVar4);
      iVar2 = Vec_IntEntry(vMap,iVar2);
      if ((iVar2 < 0) || (nVars <= iVar2)) {
        __assert_fail("iVar >= 0 && iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                      ,0x9d3,"char *Acb_RemapOneFunction(char *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      Vec_StrWriteEntry(p,(iVar2 - nVars) + p->nSize,pcVar3[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while( true );
  Vec_StrPrintF(p," %d\n",(ulong)((int)pcVar3[(int)lVar4 + 1] - 0x30));
  pcVar3 = strtok((char *)0x0,"\n");
  goto LAB_0032ddf8;
}

Assistant:

char * Acb_RemapOneFunction( char * pStr, Vec_Int_t * vSupp, Vec_Int_t * vMap, int nVars )
{
    Vec_Str_t * vTempSop = Vec_StrAlloc( 100 );
    char * pToken = strtok( pStr, "\n" );  int i; 
    while ( pToken != NULL )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vTempSop, '-' );
        for ( i = 0; pToken[i] != ' '; i++ )
            if ( pToken[i] != '-' )
            {
                int iVar = Vec_IntEntry( vMap, Vec_IntEntry(vSupp, i) );
                assert( iVar >= 0 && iVar < nVars );
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - nVars + iVar, pToken[i] );
            }
        Vec_StrPrintF( vTempSop, " %d\n", pToken[i+1] - '0' );
        pToken = strtok( NULL, "\n" );
    }
    Vec_StrPush( vTempSop, '\0' );
    pToken = Vec_StrReleaseArray(vTempSop);
    Vec_StrFree( vTempSop );
    return pToken;
}